

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O1

Status __thiscall
spvtools::opt::ScalarReplacementPass::ProcessFunction
          (ScalarReplacementPass *this,Function *function)

{
  __uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> _Var1;
  bool bVar2;
  Status SVar3;
  Status SVar4;
  Instruction *pIVar5;
  Instruction *pIVar6;
  Instruction *varInst;
  queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  worklist;
  Instruction *local_90;
  _Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  _M_initialize_map(&local_88,0);
  _Var1._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
       (((function->blocks_).
         super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t;
  pIVar6 = *(Instruction **)
            ((long)_Var1._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                   .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x20);
  pIVar5 = (Instruction *)
           ((long)_Var1._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x18);
  if (pIVar6 != pIVar5) {
    do {
      if (pIVar6->opcode_ != OpVariable) break;
      local_90 = pIVar6;
      bVar2 = CanReplaceVariable(this,pIVar6);
      if (bVar2) {
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          _M_push_back_aux<spvtools::opt::Instruction*const&>
                    ((deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                      *)&local_88,&local_90);
        }
        else {
          *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_90;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
      pIVar6 = (pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar6 != pIVar5);
  }
  SVar4 = SuccessWithoutChange;
  do {
    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_005382c2;
    pIVar6 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
      operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_88._M_impl.super__Deque_impl_data._M_start._M_last =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
      local_88._M_impl.super__Deque_impl_data._M_start._M_first =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_88._M_impl.super__Deque_impl_data._M_start._M_node =
           local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    else {
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    }
    SVar3 = ReplaceVariable(this,pIVar6,
                            (queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                             *)&local_88);
    if (SVar3 == SuccessWithChange) {
      SVar4 = SuccessWithChange;
    }
  } while (SVar3 != Failure);
  SVar4 = Failure;
LAB_005382c2:
  std::_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Deque_base(&local_88);
  return SVar4;
}

Assistant:

Pass::Status ScalarReplacementPass::ProcessFunction(Function* function) {
  std::queue<Instruction*> worklist;
  BasicBlock& entry = *function->begin();
  for (auto iter = entry.begin(); iter != entry.end(); ++iter) {
    // Function storage class OpVariables must appear as the first instructions
    // of the entry block.
    if (iter->opcode() != spv::Op::OpVariable) break;

    Instruction* varInst = &*iter;
    if (CanReplaceVariable(varInst)) {
      worklist.push(varInst);
    }
  }

  Status status = Status::SuccessWithoutChange;
  while (!worklist.empty()) {
    Instruction* varInst = worklist.front();
    worklist.pop();

    Status var_status = ReplaceVariable(varInst, &worklist);
    if (var_status == Status::Failure)
      return var_status;
    else if (var_status == Status::SuccessWithChange)
      status = var_status;
  }

  return status;
}